

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_exec(sqlite3 *db,char *zSql,sqlite3_callback xCallback,void *pArg,char **pzErrMsg)

{
  byte *pbVar1;
  ushort uVar2;
  bool bVar3;
  sqlite3_stmt *pStmt_00;
  int iVar4;
  int iVar5;
  char **p;
  char *pcVar6;
  uchar *puVar7;
  char *__src;
  ulong uVar8;
  ulong uVar9;
  char **ppcVar10;
  sqlite3_stmt *pStmt;
  int local_5c;
  void *local_58;
  sqlite3_callback local_50;
  char *zLeftover;
  sqlite3 *local_40;
  char **local_38;
  
  pStmt = (sqlite3_stmt *)0x0;
  local_50 = xCallback;
  iVar4 = sqlite3SafetyCheckOk(db);
  if (iVar4 == 0) {
    sqlite3MisuseError(0x16799);
    iVar4 = 0x15;
  }
  else {
    pcVar6 = "";
    if (zSql != (char *)0x0) {
      pcVar6 = zSql;
    }
    local_38 = pzErrMsg;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    sqlite3Error(db,0,(char *)0x0);
    iVar4 = 0;
    while (iVar4 == 0) {
      if (*pcVar6 == '\0') {
        iVar4 = 0;
        break;
      }
      pStmt = (sqlite3_stmt *)0x0;
      iVar4 = sqlite3_prepare_v2(db,pcVar6,-1,&pStmt,&zLeftover);
      if (iVar4 == 0) {
        if (pStmt == (sqlite3_stmt *)0x0) {
          iVar4 = 0;
          pcVar6 = zLeftover;
        }
        else {
          uVar2 = *(ushort *)(pStmt + 0x48);
          uVar9 = (ulong)uVar2;
          local_5c = (uint)uVar2 * 0x10 + 1;
          p = (char **)0x0;
          bVar3 = false;
          ppcVar10 = (char **)0x0;
          local_58 = pArg;
          local_40 = db;
          do {
            iVar4 = sqlite3_step(pStmt);
            if (local_50 != (sqlite3_callback)0x0) {
              if (iVar4 == 100) {
                if (!bVar3) goto LAB_0013bc37;
LAB_0013bc78:
                ppcVar10 = p + uVar9;
                for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
                  puVar7 = sqlite3_column_text(pStmt,(int)uVar8);
                  ppcVar10[uVar8] = (char *)puVar7;
                  if ((puVar7 == (uchar *)0x0) &&
                     (iVar5 = sqlite3_column_type(pStmt,(int)uVar8), iVar5 != 5)) {
                    db->mallocFailed = '\x01';
                    iVar4 = 100;
                    goto LAB_0013bd4e;
                  }
                }
              }
              else {
                if (((iVar4 != 0x65) || (bVar3)) || ((db->flags & 0x20) == 0)) break;
LAB_0013bc37:
                p = (char **)sqlite3DbMallocZero(db,local_5c);
                pStmt_00 = pStmt;
                if (p == (char **)0x0) goto LAB_0013bd4b;
                for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
                  pcVar6 = sqlite3_column_name(pStmt_00,(int)uVar8);
                  p[uVar8] = pcVar6;
                }
                db = local_40;
                if (iVar4 == 100) goto LAB_0013bc78;
              }
              iVar5 = (*local_50)(local_58,(uint)uVar2,ppcVar10,p);
              if (iVar5 != 0) {
                sqlite3VdbeFinalize((Vdbe *)pStmt);
                pStmt = (sqlite3_stmt *)0x0;
                iVar4 = 4;
                sqlite3Error(db,4,(char *)0x0);
                goto LAB_0013bd4e;
              }
              bVar3 = true;
            }
          } while (iVar4 == 100);
          iVar4 = sqlite3VdbeFinalize((Vdbe *)pStmt);
          pStmt = (sqlite3_stmt *)0x0;
          pcVar6 = zLeftover + -1;
          do {
            pbVar1 = (byte *)(pcVar6 + 1);
            pcVar6 = pcVar6 + 1;
          } while ((""[*pbVar1] & 1) != 0);
          sqlite3DbFree(db,p);
          pArg = local_58;
        }
      }
    }
LAB_0013bd4b:
    p = (char **)0x0;
LAB_0013bd4e:
    if (pStmt != (sqlite3_stmt *)0x0) {
      sqlite3VdbeFinalize((Vdbe *)pStmt);
    }
    sqlite3DbFree(db,p);
    iVar4 = sqlite3ApiExit(db,iVar4);
    ppcVar10 = local_38;
    if (((iVar4 == 0) || (iVar5 = sqlite3_errcode(db), ppcVar10 == (char **)0x0)) ||
       (iVar4 != iVar5)) {
      if (ppcVar10 != (char **)0x0) {
        *ppcVar10 = (char *)0x0;
      }
    }
    else {
      pcVar6 = sqlite3_errmsg(db);
      iVar5 = sqlite3Strlen30(pcVar6);
      pcVar6 = (char *)sqlite3Malloc(iVar5 + 1U);
      *ppcVar10 = pcVar6;
      if (pcVar6 == (char *)0x0) {
        iVar4 = 7;
        sqlite3Error(db,7,(char *)0x0);
      }
      else {
        __src = sqlite3_errmsg(db);
        memcpy(pcVar6,__src,(ulong)(iVar5 + 1U));
      }
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  return iVar4;
}

Assistant:

SQLITE_API int sqlite3_exec(
  sqlite3 *db,                /* The database on which the SQL executes */
  const char *zSql,           /* The SQL to be executed */
  sqlite3_callback xCallback, /* Invoke this callback routine */
  void *pArg,                 /* First argument to xCallback() */
  char **pzErrMsg             /* Write error messages here */
){
  int rc = SQLITE_OK;         /* Return code */
  const char *zLeftover;      /* Tail of unprocessed SQL */
  sqlite3_stmt *pStmt = 0;    /* The current SQL statement */
  char **azCols = 0;          /* Names of result columns */
  int callbackIsInit;         /* True if callback data is initialized */

  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
  if( zSql==0 ) zSql = "";

  sqlite3_mutex_enter(db->mutex);
  sqlite3Error(db, SQLITE_OK, 0);
  while( rc==SQLITE_OK && zSql[0] ){
    int nCol;
    char **azVals = 0;

    pStmt = 0;
    rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, &zLeftover);
    assert( rc==SQLITE_OK || pStmt==0 );
    if( rc!=SQLITE_OK ){
      continue;
    }
    if( !pStmt ){
      /* this happens for a comment or white-space */
      zSql = zLeftover;
      continue;
    }

    callbackIsInit = 0;
    nCol = sqlite3_column_count(pStmt);

    while( 1 ){
      int i;
      rc = sqlite3_step(pStmt);

      /* Invoke the callback function if required */
      if( xCallback && (SQLITE_ROW==rc || 
          (SQLITE_DONE==rc && !callbackIsInit
                           && db->flags&SQLITE_NullCallback)) ){
        if( !callbackIsInit ){
          azCols = sqlite3DbMallocZero(db, 2*nCol*sizeof(const char*) + 1);
          if( azCols==0 ){
            goto exec_out;
          }
          for(i=0; i<nCol; i++){
            azCols[i] = (char *)sqlite3_column_name(pStmt, i);
            /* sqlite3VdbeSetColName() installs column names as UTF8
            ** strings so there is no way for sqlite3_column_name() to fail. */
            assert( azCols[i]!=0 );
          }
          callbackIsInit = 1;
        }
        if( rc==SQLITE_ROW ){
          azVals = &azCols[nCol];
          for(i=0; i<nCol; i++){
            azVals[i] = (char *)sqlite3_column_text(pStmt, i);
            if( !azVals[i] && sqlite3_column_type(pStmt, i)!=SQLITE_NULL ){
              db->mallocFailed = 1;
              goto exec_out;
            }
          }
        }
        if( xCallback(pArg, nCol, azVals, azCols) ){
          rc = SQLITE_ABORT;
          sqlite3VdbeFinalize((Vdbe *)pStmt);
          pStmt = 0;
          sqlite3Error(db, SQLITE_ABORT, 0);
          goto exec_out;
        }
      }

      if( rc!=SQLITE_ROW ){
        rc = sqlite3VdbeFinalize((Vdbe *)pStmt);
        pStmt = 0;
        zSql = zLeftover;
        while( sqlite3Isspace(zSql[0]) ) zSql++;
        break;
      }
    }

    sqlite3DbFree(db, azCols);
    azCols = 0;
  }

exec_out:
  if( pStmt ) sqlite3VdbeFinalize((Vdbe *)pStmt);
  sqlite3DbFree(db, azCols);

  rc = sqlite3ApiExit(db, rc);
  if( rc!=SQLITE_OK && ALWAYS(rc==sqlite3_errcode(db)) && pzErrMsg ){
    int nErrMsg = 1 + sqlite3Strlen30(sqlite3_errmsg(db));
    *pzErrMsg = sqlite3Malloc(nErrMsg);
    if( *pzErrMsg ){
      memcpy(*pzErrMsg, sqlite3_errmsg(db), nErrMsg);
    }else{
      rc = SQLITE_NOMEM;
      sqlite3Error(db, SQLITE_NOMEM, 0);
    }
  }else if( pzErrMsg ){
    *pzErrMsg = 0;
  }

  assert( (rc&db->errMask)==rc );
  sqlite3_mutex_leave(db->mutex);
  return rc;
}